

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O1

future_result<rest_rpc::req_result> * __thiscall
rest_rpc::rpc_client::async_call<(rest_rpc::CallModel)0,person>
          (future_result<rest_rpc::req_result> *__return_storage_ptr__,rpc_client *this,
          string *rpc_name,person *args)

{
  char *pcVar1;
  char *message;
  uint64_t uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long lVar4;
  pointer *__ptr;
  uint64_t fu_id;
  future<rest_rpc::req_result> future;
  shared_ptr<std::promise<rest_rpc::req_result>_> p;
  msgpack_codec codec;
  buffer_type ret;
  uint64_t local_90;
  __basic_future<rest_rpc::req_result> local_88;
  promise<rest_rpc::req_result> *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  unique_lock<std::mutex> local_60;
  zone *local_48;
  buffer_type local_40;
  
  local_70 = (promise<rest_rpc::req_result> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::promise<rest_rpc::req_result>,std::allocator<std::promise<rest_rpc::req_result>>>
            (&local_68,&local_70,(allocator<std::promise<rest_rpc::req_result>_> *)&local_60);
  std::__basic_future<rest_rpc::req_result>::__basic_future(&local_88,&local_70->_M_future);
  local_90 = 0;
  local_60._M_device = &this->cb_mtx_;
  local_60._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_60);
  local_60._M_owns = true;
  local_90 = this->fu_id_ + 1;
  this->fu_id_ = local_90;
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<std::promise<rest_rpc::req_result>>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<std::promise<rest_rpc::req_result>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<unsigned_long&,std::shared_ptr<std::promise<rest_rpc::req_result>>>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<std::promise<rest_rpc::req_result>>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<std::promise<rest_rpc::req_result>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->future_map_,&local_90,&local_70);
  std::unique_lock<std::mutex>::~unique_lock(&local_60);
  local_60._M_device = (mutex_type *)((ulong)local_60._M_device & 0xffffffff00000000);
  local_48 = (zone *)0x0;
  rpc_service::msgpack_codec::pack_args<person>(&local_40,args);
  uVar2 = local_90;
  message = (rpc_name->_M_dataplus)._M_p;
  lVar4 = 0;
  do {
    pcVar1 = message + lVar4;
    lVar4 = lVar4 + 1;
  } while (*pcVar1 != '\0');
  MD5::MD5CE::ProcessMessage(message,(int)lVar4 - 1);
  write(this,(int)uVar2,(void *)0x0,(size_t)&local_40);
  _Var3._M_pi = local_88._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  __return_storage_ptr__->id = local_90;
  (__return_storage_ptr__->future).super___basic_future<rest_rpc::req_result>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->future).super___basic_future<rest_rpc::req_result>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_88._M_state.
       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (__return_storage_ptr__->future).super___basic_future<rest_rpc::req_result>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  local_88._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  free(local_40.m_data);
  if (local_48 != (zone *)0x0) {
    std::default_delete<msgpack::v1::zone>::operator()
              ((default_delete<msgpack::v1::zone> *)&local_48,local_48);
  }
  if (local_88._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

future_result<req_result> async_call(const std::string &rpc_name,
                                       Args &&...args) {
    auto p = std::make_shared<std::promise<req_result>>();
    std::future<req_result> future = p->get_future();

    uint64_t fu_id = 0;
    {
      std::unique_lock<std::mutex> lock(cb_mtx_);
      fu_id_++;
      fu_id = fu_id_;
      future_map_.emplace(fu_id, std::move(p));
    }

    rpc_service::msgpack_codec codec;
    auto ret = codec.pack_args(std::forward<Args>(args)...);
    write(fu_id, request_type::req_res, std::move(ret),
          MD5::MD5Hash32(rpc_name.data()));
    return future_result<req_result>{fu_id, std::move(future)};
  }